

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O2

int raviX_ast_simplify(CompilerState *compiler_state)

{
  int iVar1;
  
  iVar1 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar1 == 0) {
    process_expression(compiler_state,compiler_state->main_function);
  }
  return iVar1;
}

Assistant:

int raviX_ast_simplify(CompilerState *compiler_state)
{
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		process_expression(compiler_state, compiler_state->main_function);
	} else {
		// dump it?
	}
	return rc;
}